

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O1

void __thiscall sf2cute::SFInstrument::AddZone(SFInstrument *this,SFInstrumentZone *zone)

{
  int iVar1;
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  SFInstrument *pSVar4;
  invalid_argument *this_01;
  tuple<sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_> this_02;
  bool bVar5;
  __uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  local_30;
  shared_ptr<sf2cute::SFSample> local_28;
  
  if (zone->parent_instrument_ == (SFInstrument *)0x0) {
    SFInstrumentZone::set_parent_instrument(zone,this);
    this_00 = this->parent_file_;
    if (((this_00 != (SoundFont *)0x0) &&
        (p_Var2 = (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
       && (p_Var2->_M_use_count != 0)) {
      local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar3 = (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count;
        do {
          if (iVar3 == 0) {
            local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count;
          bVar5 = iVar3 == iVar1;
          if (bVar5) {
            (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count = iVar3 + 1;
            iVar1 = iVar3;
          }
          iVar3 = iVar1;
          UNLOCK();
        } while (!bVar5);
      }
      if (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count == 0;
      }
      if (bVar5) {
        local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      else {
        local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      SoundFont::AddSample(this_00,&local_28);
      if (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    this_02.
    super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
    .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
          )operator_new(0x50);
    SFInstrumentZone::SFInstrumentZone
              ((SFInstrumentZone *)
               this_02.
               super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
               .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl,zone);
    local_30._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
    .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         (tuple<sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>)
         (tuple<sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>)
         this_02.
         super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
         .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>
              ((vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                *)&local_30);
    if ((_Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
         )local_30._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
          .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl !=
        (SFInstrumentZone *)0x0) {
      (**(code **)(*(long *)local_30._M_t.
                            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl
                  + 8))();
    }
  }
  else {
    pSVar4 = SFInstrumentZone::parent_instrument(zone);
    if (pSVar4 != this) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Instrument zone has already been owned by another instrument.");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void SFInstrument::AddZone(SFInstrumentZone zone) {
  // Check the parent instrument of the zone.
  if (zone.has_parent_instrument()) {
    if (&zone.parent_instrument() == this) {
      // If the zone is already be owned by this instrument, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Instrument zone has already been owned by another instrument.");
    }
  }

  // Set this instrument to the parent instrument of the zone.
  zone.set_parent_instrument(*this);

  // If the zone has an orphan sample, add it to the parent file.
  if (has_parent_file()) {
    if (zone.has_sample()) {
      parent_file().AddSample(zone.sample());
    }
  }

  // Add the zone to the list.
  zones_.push_back(std::make_unique<SFInstrumentZone>(std::move(zone)));
}